

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

string * __thiscall
QPDFFormFieldObjectHelper::getPartialName_abi_cxx11_
          (string *__return_storage_ptr__,QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  allocator<char> local_d9;
  string local_d8 [32];
  undefined1 local_b8 [32];
  string local_98;
  allocator<char> local_71;
  string local_70 [48];
  QPDFObjectHelper local_40;
  QPDFFormFieldObjectHelper *local_18;
  QPDFFormFieldObjectHelper *this_local;
  string *result;
  
  local_40.oh_.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 0;
  local_18 = this;
  this_local = (QPDFFormFieldObjectHelper *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  QPDFObjectHelper::oh(&local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"/T",&local_71);
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)
             &local_40.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)&local_40);
  bVar1 = QPDFObjectHandle::isString
                    ((QPDFObjectHandle *)
                     &local_40.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &local_40.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_40);
  if (bVar1) {
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_d8,"/T",&local_d9);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_b8 + 0x10),(string *)local_b8);
    QPDFObjectHandle::getUTF8Value_abi_cxx11_
              ((string *)(local_b8 + 0x20),(QPDFObjectHandle *)(local_b8 + 0x10));
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)(local_b8 + 0x20));
    std::__cxx11::string::~string((string *)(local_b8 + 0x20));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_b8 + 0x10));
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator(&local_d9);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFormFieldObjectHelper::getPartialName()
{
    std::string result;
    if (oh().getKey("/T").isString()) {
        result = oh().getKey("/T").getUTF8Value();
    }
    return result;
}